

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_tests.cpp
# Opt level: O3

void __thiscall mempool_tests::MempoolSizeLimitTest::test_method(MempoolSizeLimitTest *this)

{
  CTxMemPool *this_00;
  uint uVar1;
  uint256 *puVar2;
  base_blob<256U> *pbVar3;
  bool bVar4;
  readonly_property<bool> rVar5;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar6;
  size_t sVar7;
  int64_t iVar8;
  int64_t iVar9;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar10;
  char *pcVar11;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  check_type cVar14;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined8 local_798;
  CAmount local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  vtx;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 local_620 [32];
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  CMutableTransaction tx7;
  CMutableTransaction tx6;
  CMutableTransaction tx5;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  CFeeRate maxFeeRateRemoved;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  CMutableTransaction tx3;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  CMutableTransaction tx2;
  CMutableTransaction tx1;
  TestMemPoolEntryHelper entry;
  undefined8 *local_240;
  undefined1 local_238 [8];
  char *local_230 [2];
  assertion_result local_220;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CMutableTransaction tx4;
  undefined1 local_168 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_150;
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  local_128 [4];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar11 = "m_node.mempool";
  puVar6 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                     (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.mempool,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                      ,0x1b4,"test_method","m_node.mempool");
  this_00 = (puVar6->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_device = &(this_00->cs).super_recursive_mutex;
  criticalblock2.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  CMutableTransaction::CMutableTransaction(&tx1);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx1.vin,1);
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx4);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx1.vout,1);
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx4);
  uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT71(local_168._1_7_,local_168[0]);
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168;
  }
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,
             (uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)&tx4);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  (tx1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 1000000000;
  entry.nFee = 10000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx1);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_128);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_168 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._9_7_,local_168[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_168._9_7_,local_168[8]));
  }
  CMutableTransaction::CMutableTransaction(&tx2);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx2.vin,1);
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x52);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx4);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx2.vout,1);
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x52);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx4);
  uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT71(local_168._1_7_,local_168[0]);
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168;
  }
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,
             (uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)&tx4);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  (tx2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 1000000000;
  entry.nFee = 5000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx2);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_128);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_168 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._9_7_,local_168[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_168._9_7_,local_168[8]));
  }
  sVar7 = CTxMemPool::DynamicMemoryUsage(this_00);
  CTxMemPool::TrimToSize(this_00,sVar7,(vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1c9;
  file.m_begin = (iterator)&local_308;
  msg.m_end = in_R9;
  msg.m_begin = pcVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_318,msg);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx1);
  local_168[0] = '\0';
  local_168._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_168[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_168._9_7_ =
       (undefined7)
       CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_,
                tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_);
  local_168[0x10] =
       (undefined1)
       ((uint7)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_ >> 0x30);
  local_168._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ =
       SUB83(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ =
       (uint)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x18);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ =
       (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x38);
  _cVar14 = 0x427159;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar4);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0xea806d;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xea8096;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae1c8;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_320 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx5,(lazy_ostream *)&tx3,1,0,WARN,_cVar14,(size_t)&local_328,0x1c9
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1ca;
  file_00.m_begin = (iterator)&local_338;
  msg_00.m_end = pvVar13;
  msg_00.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_348,
             msg_00);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx2);
  local_168[0] = '\0';
  local_168._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_168[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_168._9_7_ =
       (undefined7)
       CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_,
                tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_);
  local_168[0x10] =
       (undefined1)
       ((uint7)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_ >> 0x30);
  local_168._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ =
       SUB83(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ =
       (uint)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x18);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ =
       (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x38);
  _cVar14 = 0x427268;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar4);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0xea8042;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xea806b;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae1c8;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_350 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx5,(lazy_ostream *)&tx3,1,0,WARN,_cVar14,(size_t)&local_358,0x1ca
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar7 = CTxMemPool::DynamicMemoryUsage(this_00);
  CTxMemPool::TrimToSize
            (this_00,sVar7 * 3 >> 2,(vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1cd;
  file_01.m_begin = (iterator)&local_368;
  msg_01.m_end = pvVar13;
  msg_01.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_378,
             msg_01);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx1);
  local_168[0] = '\0';
  local_168._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_168[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_168._9_7_ =
       (undefined7)
       CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_,
                tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_);
  local_168[0x10] =
       (undefined1)
       ((uint7)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_ >> 0x30);
  local_168._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ =
       SUB83(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ =
       (uint)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x18);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ =
       (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x38);
  _cVar14 = 0x427399;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar4);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0xea806d;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xea8096;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae1c8;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_380 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx5,(lazy_ostream *)&tx3,1,0,WARN,_cVar14,(size_t)&local_388,0x1cd
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1ce;
  file_02.m_begin = (iterator)&local_398;
  msg_02.m_end = pvVar13;
  msg_02.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3a8,
             msg_02);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx2);
  local_168[0] = '\0';
  local_168._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_168[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_168._9_7_ =
       (undefined7)
       CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_,
                tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_);
  local_168[0x10] =
       (undefined1)
       ((uint7)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_ >> 0x30);
  local_168._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ =
       SUB83(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ =
       (uint)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x18);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ =
       (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x38);
  _cVar14 = 0x42749b;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,!bVar4);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_c0164b;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xea806b;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae1c8;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3b0 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx5,(lazy_ostream *)&tx3,1,0,WARN,_cVar14,(size_t)&local_3b8,0x1ce
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx2);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_128);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_168 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._9_7_,local_168[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_168._9_7_,local_168[8]));
  }
  CMutableTransaction::CMutableTransaction(&tx3);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx3.vin,1);
  CMutableTransaction::GetHash((Txid *)local_168,&tx2);
  *(ulong *)(((tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10) = CONCAT71(local_168._17_7_,local_168[0x10]);
  *(ulong *)(((tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x18) =
       CONCAT44(vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_);
  *(ulong *)((tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
            m_data._M_elems = CONCAT71(local_168._1_7_,local_168[0]);
  *(ulong *)(((tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 8) = CONCAT71(local_168._9_7_,local_168[8]);
  ((tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x52);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx4);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx3.vout,1);
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x53);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx4);
  uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT71(local_168._1_7_,local_168[0]);
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168;
  }
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,
             (uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)&tx4);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  (tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 1000000000;
  entry.nFee = 20000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx3);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_128);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_168 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._9_7_,local_168[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_168._9_7_,local_168[8]));
  }
  sVar7 = CTxMemPool::DynamicMemoryUsage(this_00);
  CTxMemPool::TrimToSize
            (this_00,sVar7 * 3 >> 2,(vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1db;
  file_03.m_begin = (iterator)&local_400;
  msg_03.m_end = pvVar13;
  msg_03.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_410,
             msg_03);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx1);
  local_168[0] = '\0';
  local_168._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_168[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_168._9_7_ =
       (undefined7)
       CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_,
                tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_);
  local_168[0x10] =
       (undefined1)
       ((uint7)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_ >> 0x30);
  local_168._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ =
       SUB83(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ =
       (uint)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x18);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ =
       (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x38);
  _cVar14 = 0x4277df;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,!bVar4);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_c01663;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xea8096;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae1c8;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_418 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,0,WARN,_cVar14,(size_t)&local_420,0x1db
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1dc;
  file_04.m_begin = (iterator)&local_430;
  msg_04.m_end = pvVar13;
  msg_04.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_440,
             msg_04);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx2);
  local_168[0] = '\0';
  local_168._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_168[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_168._9_7_ =
       (undefined7)
       CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_,
                tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_);
  local_168[0x10] =
       (undefined1)
       ((uint7)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_ >> 0x30);
  local_168._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ =
       SUB83(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ =
       (uint)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x18);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ =
       (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x38);
  _cVar14 = 0x4278f0;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar4);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0xea8042;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xea806b;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae1c8;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_448 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,0,WARN,_cVar14,(size_t)&local_450,0x1dc
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x1dd;
  file_05.m_begin = (iterator)&local_460;
  msg_05.m_end = pvVar13;
  msg_05.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_470,
             msg_05);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx3);
  local_168[0] = '\0';
  local_168._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_168[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_168._9_7_ =
       (undefined7)
       CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_,
                tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_);
  local_168[0x10] =
       (undefined1)
       ((uint7)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_ >> 0x30);
  local_168._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ =
       SUB83(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ =
       (uint)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x18);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ =
       (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x38);
  _cVar14 = 0x4279f9;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar4);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0xea8098;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xea80c1;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae1c8;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_478 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,0,WARN,_cVar14,(size_t)&local_480,0x1dd
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CTransaction::CTransaction((CTransaction *)local_168,&tx1);
  sVar7 = GetVirtualTransactionSize((CTransaction *)local_168,0,0);
  CTxMemPool::TrimToSize(this_00,sVar7,(vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_150);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_168);
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x1e0;
  file_06.m_begin = (iterator)&local_490;
  msg_06.m_end = pvVar13;
  msg_06.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4a0,
             msg_06);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx1);
  local_168[0] = '\0';
  local_168._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_168[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_168._9_7_ =
       (undefined7)
       CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_,
                tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_);
  local_168[0x10] =
       (undefined1)
       ((uint7)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_ >> 0x30);
  local_168._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ =
       SUB83(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ =
       (uint)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x18);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ =
       (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x38);
  _cVar14 = 0x427b56;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,!bVar4);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_c01663;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xea8096;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae1c8;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4a8 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,0,WARN,_cVar14,(size_t)&local_4b0,0x1e0
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x1e1;
  file_07.m_begin = (iterator)&local_4c0;
  msg_07.m_end = pvVar13;
  msg_07.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4d0,
             msg_07);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx2);
  local_168[0] = '\0';
  local_168._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_168[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_168._9_7_ =
       (undefined7)
       CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_,
                tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_);
  local_168[0x10] =
       (undefined1)
       ((uint7)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_ >> 0x30);
  local_168._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ =
       SUB83(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ =
       (uint)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x18);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ =
       (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x38);
  _cVar14 = 0x427c61;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,!bVar4);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_c0164b;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xea806b;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae1c8;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4d8 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,0,WARN,_cVar14,(size_t)&local_4e0,0x1e1
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x1e2;
  file_08.m_begin = (iterator)&local_4f0;
  msg_08.m_end = pvVar13;
  msg_08.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_500,
             msg_08);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx3);
  local_168[0] = '\0';
  local_168._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_168[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_168._9_7_ =
       (undefined7)
       CONCAT71(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._1_7_,
                tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_);
  local_168[0x10] =
       (undefined1)
       ((uint7)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_ >> 0x30);
  local_168._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ =
       SUB83(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ =
       (uint)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x18);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ =
       (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x38);
  _cVar14 = 0x427d73;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,!bVar4);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_c0167b;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xea80c1;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae1c8;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_508 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,0,WARN,_cVar14,(size_t)&local_510,0x1e2
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x61a8;
  CTransaction::CTransaction((CTransaction *)local_168,&tx3);
  iVar8 = GetVirtualTransactionSize((CTransaction *)local_168,0,0);
  CTransaction::CTransaction((CTransaction *)&tx4,&tx2);
  iVar9 = GetVirtualTransactionSize((CTransaction *)&tx4,0,0);
  CFeeRate::CFeeRate(&maxFeeRateRemoved,(CAmount *)&tx5,(int)iVar9 + (int)iVar8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx4.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx4.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_150);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_168);
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x1e5;
  file_09.m_begin = (iterator)&local_528;
  msg_09.m_end = pvVar13;
  msg_09.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_538,
             msg_09);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae088;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xf73bdc;
  local_220._0_8_ = CTxMemPool::GetMinFee(this_00,1);
  local_58._0_8_ = &local_220;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(maxFeeRateRemoved.nSatoshisPerK + 1000);
  local_620._0_8_ = &vtx;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           (pointer)local_220._0_8_ ==
                           vtx.
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_bf719e;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xea7f09;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_58;
  local_168[8] = '\0';
  local_168[0] = '(';
  local_168._1_7_ = 0x13ae4;
  local_168[0x10] = '8';
  local_168._17_7_ = 0x13c21;
  tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_620;
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae428;
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,2,REQUIRE,0xea80c2,(size_t)&tx7,0x1e5,
             (vector<CTxIn,_std::allocator<CTxIn>_> *)local_168,
             "maxFeeRateRemoved.GetFeePerK() + 1000",&tx4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CMutableTransaction::CMutableTransaction(&tx4);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx4.vin,2);
  pbVar3 = &((tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  pbVar3 = &((tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  puVar2 = &((tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped;
  (puVar2->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar3 = &((tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  ((tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0xffffffff;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x54);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx5);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  pbVar3 = &tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  pbVar3 = &tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  puVar2 = &tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped;
  (puVar2->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar3 = &tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  [1].prevout.n = 0xffffffff;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x54);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx5);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptSig.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx4.vout,2);
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x54);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx5);
  uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT71(local_168._1_7_,local_168[0]);
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168;
  }
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,
             (uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)&tx5);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  (tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 1000000000;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x54);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx5);
  uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT71(local_168._1_7_,local_168[0]);
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168;
  }
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,
             (uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)&tx5);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = 1000000000;
  CMutableTransaction::CMutableTransaction(&tx5);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx5.vin,2);
  CMutableTransaction::GetHash((Txid *)local_168,&tx4);
  *(ulong *)(((tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10) = CONCAT71(local_168._17_7_,local_168[0x10]);
  *(ulong *)(((tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x18) =
       CONCAT44(vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_);
  *(ulong *)((tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
            m_data._M_elems = CONCAT71(local_168._1_7_,local_168[0]);
  *(ulong *)(((tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 8) = CONCAT71(local_168._9_7_,local_168[8]);
  ((tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x54);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  pbVar3 = &tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  pbVar3 = &tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  puVar2 = &tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped;
  (puVar2->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar3 = &tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  [1].prevout.n = 0xffffffff;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x55);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptSig.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx5.vout,2);
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x55);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx6);
  uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT71(local_168._1_7_,local_168[0]);
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168;
  }
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,
             (uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)&tx6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  (tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 1000000000;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x55);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx6);
  uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT71(local_168._1_7_,local_168[0]);
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168;
  }
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,
             (uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)&tx6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = 1000000000;
  CMutableTransaction::CMutableTransaction(&tx6);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx6.vin,2);
  CMutableTransaction::GetHash((Txid *)local_168,&tx4);
  *(ulong *)(((tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10) = CONCAT71(local_168._17_7_,local_168[0x10]);
  *(ulong *)(((tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x18) =
       CONCAT44(vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_);
  *(ulong *)((tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
            m_data._M_elems = CONCAT71(local_168._1_7_,local_168[0]);
  *(ulong *)(((tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 8) = CONCAT71(local_168._9_7_,local_168[8]);
  ((tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 1;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x54);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx7);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  pbVar3 = &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  pbVar3 = &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  puVar2 = &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped;
  (puVar2->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar2->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar3 = &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  [1].prevout.n = 0xffffffff;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x56);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx7);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptSig.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx6.vout,2);
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x56);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx7);
  uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT71(local_168._1_7_,local_168[0]);
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168;
  }
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,
             (uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)&tx7);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx6.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  (tx6.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 1000000000;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x56);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&tx7);
  uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT71(local_168._1_7_,local_168[0]);
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168;
  }
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,
             (uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)&tx7);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx6.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  tx6.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = 1000000000;
  CMutableTransaction::CMutableTransaction(&tx7);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx7.vin,2);
  CMutableTransaction::GetHash((Txid *)local_168,&tx5);
  *(ulong *)(((tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10) = CONCAT71(local_168._17_7_,local_168[0x10]);
  *(ulong *)(((tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x18) =
       CONCAT44(vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_);
  *(ulong *)((tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
            m_data._M_elems = CONCAT71(local_168._1_7_,local_168[0]);
  *(ulong *)(((tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 8) = CONCAT71(local_168._9_7_,local_168[8]);
  ((tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  local_58[0] = 0x55;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  CMutableTransaction::GetHash((Txid *)local_168,&tx6);
  *(ulong *)(tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data
             ._M_elems + 0x10) = CONCAT71(local_168._17_7_,local_168[0x10]);
  *(ulong *)(tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data
             ._M_elems + 0x18) =
       CONCAT44(vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_,
                vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_);
  *(ulong *)tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data.
            _M_elems = CONCAT71(local_168._1_7_,local_168[0]);
  *(ulong *)(tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data
             ._M_elems + 8) = CONCAT71(local_168._9_7_,local_168[8]);
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  [1].prevout.n = 0;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  local_58[0] = 0x56;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptSig.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx7.vout,2);
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  local_58[0] = 'W';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             local_58);
  uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT71(local_168._1_7_,local_168[0]);
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168;
  }
  local_58[0] = 0x87;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,
             (uchar *)((long)&ppVar10->_union + (long)(int)uVar1),local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx7.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  (tx7.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 1000000000;
  local_168[0x10] = '\0';
  local_168._17_7_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_168[0] = '\0';
  local_168._1_7_ = 0;
  local_168[8] = '\0';
  local_168._9_7_ = 0;
  local_58[0] = 'W';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             local_58);
  uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ - 0x1d;
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    uVar1 = vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT71(local_168._1_7_,local_168[0]);
  if (vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ < 0x1d) {
    ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168;
  }
  local_58[0] = 0x87;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,
             (uchar *)((long)&ppVar10->_union + (long)(int)uVar1),local_58);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx7.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)CONCAT71(local_168._1_7_,local_168[0]));
  }
  tx7.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = 1000000000;
  entry.nFee = 7000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx4);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_128);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_168 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._9_7_,local_168[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_168._9_7_,local_168[8]));
  }
  entry.nFee = 1000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx5);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_128);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_168 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._9_7_,local_168[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_168._9_7_,local_168[8]));
  }
  entry.nFee = 0x44c;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx6);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_128);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_168 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._9_7_,local_168[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_168._9_7_,local_168[8]));
  }
  entry.nFee = 9000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx7);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_128);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_168 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._9_7_,local_168[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_168._9_7_,local_168[8]));
  }
  sVar7 = CTxMemPool::DynamicMemoryUsage(this_00);
  CTxMemPool::TrimToSize(this_00,sVar7 - 1,(vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x21e;
  file_10.m_begin = (iterator)&local_5f0;
  msg_10.m_end = pvVar13;
  msg_10.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_600,
             msg_10);
  CMutableTransaction::GetHash((Txid *)local_58,&tx4);
  local_168[0] = '\0';
  local_168._1_7_ = (undefined7)local_58._0_8_;
  local_168[8] = SUB81(local_58._0_8_,7);
  local_168._9_7_ = (undefined7)CONCAT71(local_58._9_7_,local_58[8]);
  local_168[0x10] = SUB71(local_58._9_7_,6);
  local_168._17_7_ = (undefined7)local_58._16_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = SUB81(local_58._16_8_,7);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ = (undefined3)local_58._24_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = SUB84(local_58._24_8_,3);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = SUB81(local_58._24_8_,7);
  _cVar14 = 0x428c05;
  rVar5.super_class_property<bool>.value =
       (class_property<bool>)CTxMemPool::exists(this_00,(GenTxid *)local_168);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_c016ab;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xea8130;
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = &vtx;
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_628 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar5.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,0,WARN,_cVar14,(size_t)&local_630,0x21e);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x21f;
  file_11.m_begin = (iterator)&local_640;
  msg_11.m_end = pvVar13;
  msg_11.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_650,
             msg_11);
  CMutableTransaction::GetHash((Txid *)local_58,&tx6);
  local_168[0] = '\0';
  local_168._1_7_ = (undefined7)local_58._0_8_;
  local_168[8] = SUB81(local_58._0_8_,7);
  local_168._9_7_ = (undefined7)CONCAT71(local_58._9_7_,local_58[8]);
  local_168[0x10] = SUB71(local_58._9_7_,6);
  local_168._17_7_ = (undefined7)local_58._16_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = SUB81(local_58._16_8_,7);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ = (undefined3)local_58._24_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = SUB84(local_58._24_8_,3);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = SUB81(local_58._24_8_,7);
  _cVar14 = 0x428d1d;
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CTxMemPool::exists(this_00,(GenTxid *)local_168);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_c016b7;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xea815a;
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = &vtx;
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_658 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,0,WARN,_cVar14,(size_t)&local_660,0x21f);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x220;
  file_12.m_begin = (iterator)&local_670;
  msg_12.m_end = pvVar13;
  msg_12.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_680,
             msg_12);
  CMutableTransaction::GetHash((Txid *)local_58,&tx7);
  local_168[0] = '\0';
  local_168._1_7_ = (undefined7)local_58._0_8_;
  local_168[8] = SUB81(local_58._0_8_,7);
  local_168._9_7_ = (undefined7)CONCAT71(local_58._9_7_,local_58[8]);
  local_168[0x10] = SUB71(local_58._9_7_,6);
  local_168._17_7_ = (undefined7)local_58._16_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = SUB81(local_58._16_8_,7);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ = (undefined3)local_58._24_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = SUB84(local_58._24_8_,3);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = SUB81(local_58._24_8_,7);
  _cVar14 = 0x428e35;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar4;
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_c016c3;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xea8185;
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = &vtx;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_688 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,0,WARN,_cVar14,(size_t)&local_690,0x220);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  CMutableTransaction::GetHash((Txid *)local_58,&tx5);
  local_168[0] = '\0';
  local_168._1_7_ = (undefined7)local_58._0_8_;
  local_168[8] = SUB81(local_58._0_8_,7);
  local_168._9_7_ = (undefined7)CONCAT71(local_58._9_7_,local_58[8]);
  local_168[0x10] = SUB71(local_58._9_7_,6);
  local_168._17_7_ = (undefined7)local_58._16_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = SUB81(local_58._16_8_,7);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ = (undefined3)local_58._24_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = SUB84(local_58._24_8_,3);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = SUB81(local_58._24_8_,7);
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  if (!bVar4) {
    entry.nFee = 1000;
    TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx5);
    CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree(local_128);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)(local_168 + 0x10));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._9_7_,local_168[8]) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT71(local_168._9_7_,local_168[8]));
    }
  }
  entry.nFee = 9000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx7);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_128);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_168 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._9_7_,local_168[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_168._9_7_,local_168[8]));
  }
  sVar7 = CTxMemPool::DynamicMemoryUsage(this_00);
  CTxMemPool::TrimToSize(this_00,sVar7 >> 1,(vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x227;
  file_13.m_begin = (iterator)&local_6a0;
  msg_13.m_end = pvVar13;
  msg_13.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_6b0,
             msg_13);
  CMutableTransaction::GetHash((Txid *)local_58,&tx4);
  local_168[0] = '\0';
  local_168._1_7_ = (undefined7)local_58._0_8_;
  local_168[8] = SUB81(local_58._0_8_,7);
  local_168._9_7_ = (undefined7)CONCAT71(local_58._9_7_,local_58[8]);
  local_168[0x10] = SUB71(local_58._9_7_,6);
  local_168._17_7_ = (undefined7)local_58._16_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = SUB81(local_58._16_8_,7);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ = (undefined3)local_58._24_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = SUB84(local_58._24_8_,3);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = SUB81(local_58._24_8_,7);
  _cVar14 = 0x429072;
  rVar5.super_class_property<bool>.value =
       (class_property<bool>)CTxMemPool::exists(this_00,(GenTxid *)local_168);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_c016ab;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xea8130;
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = &vtx;
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_6b8 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar5.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,0,WARN,_cVar14,(size_t)&local_6c0,0x227);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x228;
  file_14.m_begin = (iterator)&local_6d0;
  msg_14.m_end = pvVar13;
  msg_14.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_6e0,
             msg_14);
  CMutableTransaction::GetHash((Txid *)local_58,&tx5);
  local_168[0] = '\0';
  local_168._1_7_ = (undefined7)local_58._0_8_;
  local_168[8] = SUB81(local_58._0_8_,7);
  local_168._9_7_ = (undefined7)CONCAT71(local_58._9_7_,local_58[8]);
  local_168[0x10] = SUB71(local_58._9_7_,6);
  local_168._17_7_ = (undefined7)local_58._16_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = SUB81(local_58._16_8_,7);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ = (undefined3)local_58._24_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = SUB84(local_58._24_8_,3);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = SUB81(local_58._24_8_,7);
  _cVar14 = 0x42917c;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar4;
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_c016cf;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xea81b0;
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = &vtx;
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_6e8 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,0,WARN,_cVar14,(size_t)&local_6f0,0x228);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x229;
  file_15.m_begin = (iterator)&local_700;
  msg_15.m_end = pvVar13;
  msg_15.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_710,
             msg_15);
  CMutableTransaction::GetHash((Txid *)local_58,&tx6);
  local_168[0] = '\0';
  local_168._1_7_ = (undefined7)local_58._0_8_;
  local_168[8] = SUB81(local_58._0_8_,7);
  local_168._9_7_ = (undefined7)CONCAT71(local_58._9_7_,local_58[8]);
  local_168[0x10] = SUB71(local_58._9_7_,6);
  local_168._17_7_ = (undefined7)local_58._16_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = SUB81(local_58._16_8_,7);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ = (undefined3)local_58._24_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = SUB84(local_58._24_8_,3);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = SUB81(local_58._24_8_,7);
  _cVar14 = 0x429296;
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CTxMemPool::exists(this_00,(GenTxid *)local_168);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_c016b7;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xea815a;
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = &vtx;
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_718 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,0,WARN,_cVar14,(size_t)&local_720,0x229);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x22a;
  file_16.m_begin = (iterator)&local_730;
  msg_16.m_end = pvVar13;
  msg_16.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_740,
             msg_16);
  CMutableTransaction::GetHash((Txid *)local_58,&tx7);
  local_168[0] = '\0';
  local_168._1_7_ = (undefined7)local_58._0_8_;
  local_168[8] = SUB81(local_58._0_8_,7);
  local_168._9_7_ = (undefined7)CONCAT71(local_58._9_7_,local_58[8]);
  local_168[0x10] = SUB71(local_58._9_7_,6);
  local_168._17_7_ = (undefined7)local_58._16_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = SUB81(local_58._16_8_,7);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._1_3_ = (undefined3)local_58._24_8_;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = SUB84(local_58._24_8_,3);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = SUB81(local_58._24_8_,7);
  _cVar14 = 0x4293ae;
  bVar4 = CTxMemPool::exists(this_00,(GenTxid *)local_168);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar4;
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_c016c3;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xea8185;
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = &vtx;
  local_750 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_748 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,0,WARN,_cVar14,(size_t)&local_750,0x22a);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  entry.nFee = 1000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx5);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_128);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_168 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._9_7_,local_168[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_168._9_7_,local_168[8]));
  }
  entry.nFee = 9000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_168,&entry,&tx7);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree(local_128);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_168 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._9_7_,local_168[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_168._9_7_,local_168[8]));
  }
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetMockTime(0x2a);
  SetMockTime(0xa8ea);
  local_778 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_770 = "";
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x232;
  file_17.m_begin = (iterator)&local_778;
  msg_17.m_end = pvVar13;
  msg_17.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_788,
             msg_17);
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae088;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_790 = (CAmount)CTxMemPool::GetMinFee(this_00,1);
  local_238 = (undefined1  [8])&local_790;
  local_798 = maxFeeRateRemoved.nSatoshisPerK + 1000;
  local_240 = &local_798;
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_230[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_168[8] = '\0';
  local_168[0] = '(';
  local_168._1_7_ = 0x13ae4;
  local_168[0x10] = '8';
  local_168._17_7_ = 0x13c21;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  local_58._24_8_ = &local_240;
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_790 == local_798);
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_238;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,2,REQUIRE,0xea80c2,(size_t)local_230,0x232,
             local_168,"maxFeeRateRemoved.GetFeePerK() + 1000",local_58);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  CTxMemPool::removeForBlock(this_00,&vtx,1);
  SetMockTime(0x151aa);
  local_7a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_7a0 = "";
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x236;
  file_18.m_begin = (iterator)&local_7a8;
  msg_18.m_end = pvVar13;
  msg_18.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_7b8,
             msg_18);
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae088;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_790 = (CAmount)CTxMemPool::GetMinFee(this_00,1);
  local_798 = llround((double)(maxFeeRateRemoved.nSatoshisPerK + 1000) * 0.5);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_790 == local_798);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_230[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_238 = (undefined1  [8])&local_790;
  local_168[8] = '\0';
  local_168[0] = '(';
  local_168._1_7_ = 0x13ae4;
  local_168[0x10] = '8';
  local_168._17_7_ = 0x13c21;
  local_240 = &local_798;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_013ae958;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  local_58._24_8_ = &local_240;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_238;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,2,REQUIRE,0xea80c2,(size_t)local_230,0x236,
             local_168,"llround((maxFeeRateRemoved.GetFeePerK() + 1000)/2.0)",local_58);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  SetMockTime(0x1a60a);
  local_7c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x23a;
  file_19.m_begin = (iterator)&local_7c8;
  msg_19.m_end = pvVar13;
  msg_19.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_7d8,
             msg_19);
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae088;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  sVar7 = CTxMemPool::DynamicMemoryUsage(this_00);
  local_790 = (CAmount)CTxMemPool::GetMinFee(this_00,sVar7 * 5 >> 1);
  local_798 = llround((double)(maxFeeRateRemoved.nSatoshisPerK + 1000) * 0.25);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_790 == local_798);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_230[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_238 = (undefined1  [8])&local_790;
  local_168[8] = '\0';
  local_168[0] = '(';
  local_168._1_7_ = 0x13ae4;
  local_168[0x10] = '8';
  local_168._17_7_ = 0x13c21;
  local_240 = &local_798;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_013ae958;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  local_58._24_8_ = &local_240;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_238;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,2,REQUIRE,0xea81e6,(size_t)local_230,0x23a,
             local_168,"llround((maxFeeRateRemoved.GetFeePerK() + 1000)/4.0)",local_58);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  SetMockTime(0x1d03a);
  local_7e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x23e;
  file_20.m_begin = (iterator)&local_7e8;
  msg_20.m_end = pvVar13;
  msg_20.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_7f8,
             msg_20);
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae088;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  sVar7 = CTxMemPool::DynamicMemoryUsage(this_00);
  local_790 = (CAmount)CTxMemPool::GetMinFee(this_00,sVar7 * 9 >> 1);
  local_798 = llround((double)(maxFeeRateRemoved.nSatoshisPerK + 1000) * 0.125);
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_790 == local_798);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_230[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_238 = (undefined1  [8])&local_790;
  local_168[8] = '\0';
  local_168[0] = '(';
  local_168._1_7_ = 0x13ae4;
  local_168[0x10] = '8';
  local_168._17_7_ = 0x13c21;
  local_240 = &local_798;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_013ae958;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  local_58._24_8_ = &local_240;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_238;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,2,REQUIRE,0xea825a,(size_t)local_230,0x23e,
             local_168,"llround((maxFeeRateRemoved.GetFeePerK() + 1000)/8.0)",local_58);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  SetMockTime(0x51bfa);
  local_808 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_800 = "";
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x242;
  file_21.m_begin = (iterator)&local_808;
  msg_21.m_end = pvVar13;
  msg_21.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_818,
             msg_21);
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae088;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_790 = (CAmount)CTxMemPool::GetMinFee(this_00,1);
  local_798._0_4_ = 1000;
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_790 == 1000);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_230[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_238 = (undefined1  [8])&local_790;
  local_168[8] = '\0';
  local_168[0] = '(';
  local_168._1_7_ = 0x13ae4;
  local_168[0x10] = '8';
  local_168._17_7_ = 0x13c21;
  local_240 = &local_798;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_013ae248;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x2;
  local_58._24_8_ = &local_240;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_238;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,2,REQUIRE,0xea80c2,(size_t)local_230,0x242,
             local_168,"1000",local_58);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  SetMockTime(0x5c4ba);
  local_828 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_820 = "";
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x246;
  file_22.m_begin = (iterator)&local_828;
  msg_22.m_end = pvVar13;
  msg_22.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_838,
             msg_22);
  local_620[8] = '\0';
  local_620._0_8_ = &PTR__lazy_ostream_013ae088;
  local_620._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_620._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_790 = (CAmount)CTxMemPool::GetMinFee(this_00,1);
  local_798 = (ulong)local_798._4_4_ << 0x20;
  local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_790 == 0);
  local_220.m_message.px = (element_type *)0x0;
  local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230[0] = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_230[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                         + 0x5f);
  local_238 = (undefined1  [8])&local_790;
  local_168[8] = '\0';
  local_168[0] = '(';
  local_168._1_7_ = 0x13ae4;
  local_168[0x10] = '8';
  local_168._17_7_ = 0x13c21;
  local_240 = &local_798;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_013ae248;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58._24_8_ = &local_240;
  vStack_150.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_238;
  boost::test_tools::tt_detail::report_assertion
            (&local_220,(lazy_ostream *)local_620,1,2,REQUIRE,0xea80c2,(size_t)local_230,0x246,
             local_168,"0",local_58);
  boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&vtx);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx7.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx7.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx6.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx6.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx5.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx5.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx4.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx4.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx3.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx3.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx2.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx2.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx1.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx1.vin);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(MempoolSizeLimitTest)
{
    auto& pool = static_cast<MemPoolTest&>(*Assert(m_node.mempool));
    LOCK2(cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    CMutableTransaction tx1 = CMutableTransaction();
    tx1.vin.resize(1);
    tx1.vin[0].scriptSig = CScript() << OP_1;
    tx1.vout.resize(1);
    tx1.vout[0].scriptPubKey = CScript() << OP_1 << OP_EQUAL;
    tx1.vout[0].nValue = 10 * COIN;
    pool.addUnchecked(entry.Fee(10000LL).FromTx(tx1));

    CMutableTransaction tx2 = CMutableTransaction();
    tx2.vin.resize(1);
    tx2.vin[0].scriptSig = CScript() << OP_2;
    tx2.vout.resize(1);
    tx2.vout[0].scriptPubKey = CScript() << OP_2 << OP_EQUAL;
    tx2.vout[0].nValue = 10 * COIN;
    pool.addUnchecked(entry.Fee(5000LL).FromTx(tx2));

    pool.TrimToSize(pool.DynamicMemoryUsage()); // should do nothing
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx1.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx2.GetHash())));

    pool.TrimToSize(pool.DynamicMemoryUsage() * 3 / 4); // should remove the lower-feerate transaction
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx1.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx2.GetHash())));

    pool.addUnchecked(entry.FromTx(tx2));
    CMutableTransaction tx3 = CMutableTransaction();
    tx3.vin.resize(1);
    tx3.vin[0].prevout = COutPoint(tx2.GetHash(), 0);
    tx3.vin[0].scriptSig = CScript() << OP_2;
    tx3.vout.resize(1);
    tx3.vout[0].scriptPubKey = CScript() << OP_3 << OP_EQUAL;
    tx3.vout[0].nValue = 10 * COIN;
    pool.addUnchecked(entry.Fee(20000LL).FromTx(tx3));

    pool.TrimToSize(pool.DynamicMemoryUsage() * 3 / 4); // tx3 should pay for tx2 (CPFP)
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx1.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx2.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx3.GetHash())));

    pool.TrimToSize(GetVirtualTransactionSize(CTransaction(tx1))); // mempool is limited to tx1's size in memory usage, so nothing fits
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx1.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx2.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx3.GetHash())));

    CFeeRate maxFeeRateRemoved(25000, GetVirtualTransactionSize(CTransaction(tx3)) + GetVirtualTransactionSize(CTransaction(tx2)));
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), maxFeeRateRemoved.GetFeePerK() + 1000);

    CMutableTransaction tx4 = CMutableTransaction();
    tx4.vin.resize(2);
    tx4.vin[0].prevout.SetNull();
    tx4.vin[0].scriptSig = CScript() << OP_4;
    tx4.vin[1].prevout.SetNull();
    tx4.vin[1].scriptSig = CScript() << OP_4;
    tx4.vout.resize(2);
    tx4.vout[0].scriptPubKey = CScript() << OP_4 << OP_EQUAL;
    tx4.vout[0].nValue = 10 * COIN;
    tx4.vout[1].scriptPubKey = CScript() << OP_4 << OP_EQUAL;
    tx4.vout[1].nValue = 10 * COIN;

    CMutableTransaction tx5 = CMutableTransaction();
    tx5.vin.resize(2);
    tx5.vin[0].prevout = COutPoint(tx4.GetHash(), 0);
    tx5.vin[0].scriptSig = CScript() << OP_4;
    tx5.vin[1].prevout.SetNull();
    tx5.vin[1].scriptSig = CScript() << OP_5;
    tx5.vout.resize(2);
    tx5.vout[0].scriptPubKey = CScript() << OP_5 << OP_EQUAL;
    tx5.vout[0].nValue = 10 * COIN;
    tx5.vout[1].scriptPubKey = CScript() << OP_5 << OP_EQUAL;
    tx5.vout[1].nValue = 10 * COIN;

    CMutableTransaction tx6 = CMutableTransaction();
    tx6.vin.resize(2);
    tx6.vin[0].prevout = COutPoint(tx4.GetHash(), 1);
    tx6.vin[0].scriptSig = CScript() << OP_4;
    tx6.vin[1].prevout.SetNull();
    tx6.vin[1].scriptSig = CScript() << OP_6;
    tx6.vout.resize(2);
    tx6.vout[0].scriptPubKey = CScript() << OP_6 << OP_EQUAL;
    tx6.vout[0].nValue = 10 * COIN;
    tx6.vout[1].scriptPubKey = CScript() << OP_6 << OP_EQUAL;
    tx6.vout[1].nValue = 10 * COIN;

    CMutableTransaction tx7 = CMutableTransaction();
    tx7.vin.resize(2);
    tx7.vin[0].prevout = COutPoint(tx5.GetHash(), 0);
    tx7.vin[0].scriptSig = CScript() << OP_5;
    tx7.vin[1].prevout = COutPoint(tx6.GetHash(), 0);
    tx7.vin[1].scriptSig = CScript() << OP_6;
    tx7.vout.resize(2);
    tx7.vout[0].scriptPubKey = CScript() << OP_7 << OP_EQUAL;
    tx7.vout[0].nValue = 10 * COIN;
    tx7.vout[1].scriptPubKey = CScript() << OP_7 << OP_EQUAL;
    tx7.vout[1].nValue = 10 * COIN;

    pool.addUnchecked(entry.Fee(7000LL).FromTx(tx4));
    pool.addUnchecked(entry.Fee(1000LL).FromTx(tx5));
    pool.addUnchecked(entry.Fee(1100LL).FromTx(tx6));
    pool.addUnchecked(entry.Fee(9000LL).FromTx(tx7));

    // we only require this to remove, at max, 2 txn, because it's not clear what we're really optimizing for aside from that
    pool.TrimToSize(pool.DynamicMemoryUsage() - 1);
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx4.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx6.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx7.GetHash())));

    if (!pool.exists(GenTxid::Txid(tx5.GetHash())))
        pool.addUnchecked(entry.Fee(1000LL).FromTx(tx5));
    pool.addUnchecked(entry.Fee(9000LL).FromTx(tx7));

    pool.TrimToSize(pool.DynamicMemoryUsage() / 2); // should maximize mempool size by only removing 5/7
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx4.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx5.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx6.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx7.GetHash())));

    pool.addUnchecked(entry.Fee(1000LL).FromTx(tx5));
    pool.addUnchecked(entry.Fee(9000LL).FromTx(tx7));

    std::vector<CTransactionRef> vtx;
    SetMockTime(42);
    SetMockTime(42 + CTxMemPool::ROLLING_FEE_HALFLIFE);
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), maxFeeRateRemoved.GetFeePerK() + 1000);
    // ... we should keep the same min fee until we get a block
    pool.removeForBlock(vtx, 1);
    SetMockTime(42 + 2*CTxMemPool::ROLLING_FEE_HALFLIFE);
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), llround((maxFeeRateRemoved.GetFeePerK() + 1000)/2.0));
    // ... then feerate should drop 1/2 each halflife

    SetMockTime(42 + 2*CTxMemPool::ROLLING_FEE_HALFLIFE + CTxMemPool::ROLLING_FEE_HALFLIFE/2);
    BOOST_CHECK_EQUAL(pool.GetMinFee(pool.DynamicMemoryUsage() * 5 / 2).GetFeePerK(), llround((maxFeeRateRemoved.GetFeePerK() + 1000)/4.0));
    // ... with a 1/2 halflife when mempool is < 1/2 its target size

    SetMockTime(42 + 2*CTxMemPool::ROLLING_FEE_HALFLIFE + CTxMemPool::ROLLING_FEE_HALFLIFE/2 + CTxMemPool::ROLLING_FEE_HALFLIFE/4);
    BOOST_CHECK_EQUAL(pool.GetMinFee(pool.DynamicMemoryUsage() * 9 / 2).GetFeePerK(), llround((maxFeeRateRemoved.GetFeePerK() + 1000)/8.0));
    // ... with a 1/4 halflife when mempool is < 1/4 its target size

    SetMockTime(42 + 7*CTxMemPool::ROLLING_FEE_HALFLIFE + CTxMemPool::ROLLING_FEE_HALFLIFE/2 + CTxMemPool::ROLLING_FEE_HALFLIFE/4);
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), 1000);
    // ... but feerate should never drop below 1000

    SetMockTime(42 + 8*CTxMemPool::ROLLING_FEE_HALFLIFE + CTxMemPool::ROLLING_FEE_HALFLIFE/2 + CTxMemPool::ROLLING_FEE_HALFLIFE/4);
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), 0);
    // ... unless it has gone all the way to 0 (after getting past 1000/2)
}